

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::Parser::SkipStatement(Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  Tokenizer *this_00;
  
  do {
    this_00 = this->input_;
    TVar1 = (this_00->current_).type;
    if (TVar1 == TYPE_SYMBOL) {
      bVar2 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
      if (bVar2) {
        return;
      }
      bVar2 = TryConsume(this,"{");
      if (bVar2) {
        SkipRestOfBlock(this);
        return;
      }
      bVar2 = LookingAt(this,"}");
      if (bVar2) {
        return;
      }
      this_00 = this->input_;
    }
    else if (TVar1 == TYPE_END) {
      return;
    }
    io::Tokenizer::Next(this_00);
  } while( true );
}

Assistant:

void Parser::SkipStatement() {
  while (true) {
    if (AtEnd()) {
      return;
    } else if (LookingAtType(io::Tokenizer::TYPE_SYMBOL)) {
      if (TryConsumeEndOfDeclaration(";", NULL)) {
        return;
      } else if (TryConsume("{")) {
        SkipRestOfBlock();
        return;
      } else if (LookingAt("}")) {
        return;
      }
    }
    input_->Next();
  }
}